

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentImpl.cpp
# Opt level: O2

void * __thiscall
xercesc_4_0::DOMDocumentImpl::getUserData(DOMDocumentImpl *this,DOMNodeImpl *n,XMLCh *key)

{
  uint key2;
  KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler> *pKVar1;
  
  if (this->fUserDataTable ==
      (RefHash2KeysTableOf<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
       *)0x0) {
    return (void *)0x0;
  }
  key2 = XMLStringPool::getId(&this->fUserDataTableKeys,key);
  if ((key2 != 0) &&
     (pKVar1 = RefHash2KeysTableOf<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
               ::get(this->fUserDataTable,n,key2),
     pKVar1 != (KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler> *)0x0)) {
    return pKVar1->fKey;
  }
  return (void *)0x0;
}

Assistant:

void* DOMDocumentImpl::getUserData(const DOMNodeImpl* n, const XMLCh* key) const
{
    if (fUserDataTable) {
        unsigned int keyId=fUserDataTableKeys.getId(key);
        if(keyId!=0) {
            DOMUserDataRecord* dataRecord = fUserDataTable->get((void*)n, keyId);
            if (dataRecord)
                return dataRecord->getKey();
        }
    }

    return 0;
}